

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O2

Aig_Obj_t *
Saig_StrSimTableLookup(Aig_Obj_t **ppTable,Aig_Obj_t **ppNexts,int nTableSize,Aig_Obj_t *pObj)

{
  Aig_Obj_t *pObj0;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = Saig_StrSimHash(pObj);
  uVar3 = (ulong)uVar1 % (ulong)(uint)nTableSize;
  while( true ) {
    pObj0 = ppTable[(int)uVar3];
    if (pObj0 == (Aig_Obj_t *)0x0) {
      return (Aig_Obj_t *)0x0;
    }
    iVar2 = Saig_StrSimIsEqual(pObj0,pObj);
    if (iVar2 != 0) break;
    uVar3 = (ulong)(uint)pObj0->Id;
    ppTable = ppNexts;
  }
  return pObj0;
}

Assistant:

Aig_Obj_t * Saig_StrSimTableLookup( Aig_Obj_t ** ppTable, Aig_Obj_t ** ppNexts, int nTableSize, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pEntry;
    int iEntry;
    // find the hash entry
    iEntry = Saig_StrSimHash( pObj ) % nTableSize;
    // check if there are nodes with this signatures
    for ( pEntry = ppTable[iEntry]; pEntry; pEntry = Saig_ObjNext(ppNexts,pEntry) )
        if ( Saig_StrSimIsEqual( pEntry, pObj ) )
            return pEntry;
    return NULL;
}